

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::internal::ArgVisitor<fmt::internal::ArgFormatter<wchar_t>,_void>::visit
          (ArgVisitor<fmt::internal::ArgFormatter<wchar_t>,_void> *this,Arg *arg)

{
  switch(arg->type) {
  case INT:
    BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t>::visit_any_int<int>
              ((BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t> *)this,
               (arg->super_Value).field_0.int_value);
    return;
  case UINT:
    BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t>::visit_any_int<unsigned_int>
              ((BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t> *)this,
               (arg->super_Value).field_0.uint_value);
    return;
  case LONG_LONG:
    BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t>::visit_any_int<long_long>
              ((BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t> *)this,
               (arg->super_Value).field_0.long_long_value);
    return;
  case ULONG_LONG:
    BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t>::
    visit_any_int<unsigned_long_long>
              ((BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t> *)this,
               (arg->super_Value).field_0.ulong_long_value);
    return;
  case BOOL:
    BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t>::visit_bool
              ((BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t> *)this,
               (arg->super_Value).field_0.int_value != 0);
    return;
  case CHAR:
    BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t>::visit_char
              ((BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t> *)this,
               (arg->super_Value).field_0.int_value);
    return;
  case DOUBLE:
    BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t>::visit_any_double<double>
              ((BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t> *)this,
               (arg->super_Value).field_0.double_value);
    return;
  case LAST_NUMERIC_TYPE:
    BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t>::visit_any_double<long_double>
              ((BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t> *)this,
               (arg->super_Value).field_0.long_double_value);
    return;
  case CSTRING:
    BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t>::visit_cstring
              ((BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t> *)this,
               (arg->super_Value).field_0.string.value);
    return;
  case STRING:
    BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t>::visit_string
              ((BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t> *)this,
               (arg->super_Value).field_0.string);
    return;
  case WSTRING:
    BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t>::visit_wstring
              ((BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t> *)this,
               (arg->super_Value).field_0.wstring);
    return;
  case POINTER:
    BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t>::visit_pointer
              ((BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t> *)this,
               (arg->super_Value).field_0.pointer);
    return;
  case CUSTOM:
    (*(arg->super_Value).field_0.custom.format)
              (*(void **)(this + 0x10),(void *)(arg->super_Value).field_0.long_long_value,
               this + 0x18);
    return;
  default:
    __assert_fail("(false) && \"invalid argument type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/cppformat/cppformat/format.h"
                  ,0x4f9,
                  "Result fmt::internal::ArgVisitor<fmt::internal::ArgFormatter<wchar_t>, void>::visit(const Arg &) [Impl = fmt::internal::ArgFormatter<wchar_t>, Result = void]"
                 );
  }
}

Assistant:

Result visit(const Arg &arg) {
    switch (arg.type) {
    default:
      FMT_ASSERT(false, "invalid argument type");
      return Result();
    case Arg::INT:
      return FMT_DISPATCH(visit_int(arg.int_value));
    case Arg::UINT:
      return FMT_DISPATCH(visit_uint(arg.uint_value));
    case Arg::LONG_LONG:
      return FMT_DISPATCH(visit_long_long(arg.long_long_value));
    case Arg::ULONG_LONG:
      return FMT_DISPATCH(visit_ulong_long(arg.ulong_long_value));
    case Arg::BOOL:
      return FMT_DISPATCH(visit_bool(arg.int_value != 0));
    case Arg::CHAR:
      return FMT_DISPATCH(visit_char(arg.int_value));
    case Arg::DOUBLE:
      return FMT_DISPATCH(visit_double(arg.double_value));
    case Arg::LONG_DOUBLE:
      return FMT_DISPATCH(visit_long_double(arg.long_double_value));
    case Arg::CSTRING:
      return FMT_DISPATCH(visit_cstring(arg.string.value));
    case Arg::STRING:
      return FMT_DISPATCH(visit_string(arg.string));
    case Arg::WSTRING:
      return FMT_DISPATCH(visit_wstring(arg.wstring));
    case Arg::POINTER:
      return FMT_DISPATCH(visit_pointer(arg.pointer));
    case Arg::CUSTOM:
      return FMT_DISPATCH(visit_custom(arg.custom));
    }
  }